

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.h
# Opt level: O2

WallDuration * __thiscall
miniros::DurationBase<miniros::WallDuration>::operator-=
          (DurationBase<miniros::WallDuration> *this,WallDuration *rhs)

{
  DurationBase<miniros::WallDuration> DStack_18;
  
  operator-(&DStack_18);
  operator+=(this,(WallDuration *)&DStack_18);
  return (WallDuration *)this;
}

Assistant:

T& DurationBase<T>::operator-=(const T &rhs)
  {
    *this += (-rhs);
    return *static_cast<T*>(this);
  }